

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric_stats.hpp
# Opt level: O2

void __thiscall
duckdb::NumericStats::UpdateValue<duckdb::hugeint_t>
          (NumericStats *this,hugeint_t new_value,hugeint_t *min,hugeint_t *max)

{
  int64_t iVar1;
  hugeint_t *phVar2;
  hugeint_t *phVar3;
  hugeint_t new_value_local;
  
  phVar2 = (hugeint_t *)new_value.upper;
  new_value_local.upper = new_value.lower;
  new_value_local.lower = (uint64_t)this;
  phVar3 = phVar2;
  if (phVar2->upper == new_value_local.upper) {
    phVar3 = &new_value_local;
  }
  if ((NumericStats *)phVar2->lower <= this) {
    phVar3 = phVar2;
  }
  if (new_value_local.upper < phVar2->upper) {
    phVar3 = &new_value_local;
  }
  iVar1 = phVar3->upper;
  phVar2->lower = phVar3->lower;
  phVar2->upper = iVar1;
  phVar3 = min;
  if (min->upper == new_value_local.upper) {
    phVar3 = &new_value_local;
  }
  if (this <= (NumericStats *)min->lower) {
    phVar3 = min;
  }
  if (min->upper < new_value_local.upper) {
    phVar3 = &new_value_local;
  }
  iVar1 = phVar3->upper;
  min->lower = phVar3->lower;
  min->upper = iVar1;
  return;
}

Assistant:

static inline void UpdateValue(T new_value, T &min, T &max) {
		min = LessThan::Operation(new_value, min) ? new_value : min;
		max = GreaterThan::Operation(new_value, max) ? new_value : max;
	}